

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

void __thiscall HPresolve::setBasisElement(HPresolve *this,change c)

{
  _Elt_pointer pcVar1;
  reference pvVar2;
  int iVar3;
  size_type sVar4;
  int local_28 [2];
  
  iVar3 = c.col;
  if (0xd < (uint)c.type) {
    return;
  }
  local_28[0] = iVar3;
  switch(c.type) {
  case 0:
  case 4:
  case 5:
    pvVar2 = std::vector<int,_std::allocator<int>_>::at
                       (&(this->super_HPreData).nonbasicFlag,
                        (long)c.row + (long)(this->super_HPreData).numColOriginal);
    *pvVar2 = 0;
    return;
  case 1:
    sVar4 = std::deque<change,_std::allocator<change>_>::size(&(this->super_HPreData).chng.c);
    if (sVar4 == 0) {
      return;
    }
    pcVar1 = (this->super_HPreData).chng.c.super__Deque_base<change,_std::allocator<change>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pcVar1 == *(_Elt_pointer *)
                   ((long)&(this->super_HPreData).chng.c.
                           super__Deque_base<change,_std::allocator<change>_>._M_impl.
                           super__Deque_impl_data._M_finish + 8)) {
      pcVar1 = (*(_Map_pointer *)
                 ((long)&(this->super_HPreData).chng.c.
                         super__Deque_base<change,_std::allocator<change>_>._M_impl.
                         super__Deque_impl_data._M_finish + 0x18))[-1] + 0x2a;
    }
    if (pcVar1[-1].type == 2) {
      return;
    }
  case 10:
  case 0xb:
  case 0xd:
    sVar4 = (size_type)iVar3;
    goto LAB_0014692b;
  default:
    goto switchD_0014686f_caseD_2;
  case 7:
  case 9:
    (this->super_HPreData).nonbasicFlag.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[iVar3] = 0;
    break;
  case 8:
    pvVar2 = std::vector<int,_std::allocator<int>_>::at
                       (&(this->super_HPreData).nonbasicFlag,(long)iVar3);
    *pvVar2 = 0;
  }
  std::vector<int,_std::allocator<int>_>::push_back(&(this->super_HPreData).basicIndex,local_28);
  sVar4 = (long)c.row + (long)(this->super_HPreData).numColOriginal;
LAB_0014692b:
  pvVar2 = std::vector<int,_std::allocator<int>_>::at(&(this->super_HPreData).nonbasicFlag,sVar4);
  *pvVar2 = 1;
switchD_0014686f_caseD_2:
  return;
}

Assistant:

void HPresolve::setBasisElement(change c) {

	//nonbasicFlag starts off as [numCol + numRow] and is already
	//increased to [numColOriginal + numRowOriginal] so fill in gaps

	switch (c.type) {
		case EMPTY_ROW: {
			nonbasicFlag.at(numColOriginal + c.row) = 0;
			break;
		}
		case SING_ROW: {
			//elsewhere
			break;
		}
		case FORCING_ROW_VARIABLE:
			// variables set at a bound by forcing row fRjs.p
			// all nonbasic

			break;
		case FORCING_ROW: {
			nonbasicFlag.at(numColOriginal + c.row) = 0;
			break;
		}
		case REDUNDANT_ROW: {
			nonbasicFlag.at(numColOriginal + c.row) = 0;
			break;
		}
		case FREE_SING_COL:
		case IMPLIED_FREE_SING_COL: {
			nonbasicFlag[c.col] = 0;
			basicIndex.push_back(c.col);

			nonbasicFlag.at(numColOriginal + c.row) = 1;
			break;
		}
		case SING_COL_DOUBLETON_INEQ: {
			// column singleton in a doubleton inequality.
			nonbasicFlag.at(c.col) = 0;
			basicIndex.push_back(c.col);

			nonbasicFlag.at(numColOriginal + c.row) = 1;
			break;
		}
		case EMPTY_COL:
		case DOMINATED_COLS:
		case WEAKLY_DOMINATED_COLS: {
			nonbasicFlag.at(c.col) = 1;
			break;
		}
		case FIXED_COL: { //fixed variable:
			//check if it was NOT after singRow
			if (chng.size() > 0)
				if (chng.top().type != SING_ROW)
					nonbasicFlag.at(c.col) = 1;
			break;
		}

	}

}